

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_2::ValidateBinaryUsingContextAndValidationState
          (spv_context_t *context,uint32_t *words,size_t num_words,spv_diagnostic *pDiagnostic,
          ValidationState_t *vstate)

{
  pointer psVar1;
  pointer pIVar2;
  spv_position_t position;
  spv_position_t position_00;
  spv_position_t position_01;
  spv_position_t position_02;
  Instruction *pIVar3;
  _Manager_type p_Var4;
  __type _Var5;
  bool bVar6;
  uint16_t uVar7;
  spv_result_t sVar8;
  uint32_t uVar9;
  uint uVar10;
  ExecutionModel execution_model;
  ExecutionModel EVar11;
  __uniq_ptr_data<spv_const_binary_t,_std::default_delete<spv_const_binary_t>,_true,_true> binary_00
  ;
  char *pcVar12;
  DiagnosticStream *pDVar13;
  Function *pFVar14;
  BasicBlock *pBVar15;
  size_t sVar16;
  const_iterator cVar17;
  Instruction *pIVar18;
  Instruction *inst_00;
  iterator __begin6;
  long lVar19;
  pointer ppIVar20;
  pointer puVar21;
  char *pcVar22;
  size_t j;
  ulong uVar23;
  pointer pIVar24;
  ValidationState_t *_;
  pointer val;
  Instruction *inst;
  undefined8 local_548;
  ValidationState_t *local_540;
  undefined8 local_538;
  undefined8 local_530;
  spv_endianness_t endian;
  ulong local_520;
  Instruction *local_518;
  pointer local_510;
  pointer local_508;
  unique_ptr<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_> binary;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
  visited_entry_points;
  vector<unsigned_int,_std::allocator<unsigned_int>_> interfaces;
  spv_header_t header;
  spv_context_t hijacked_context;
  string desc_name;
  string check_name;
  undefined1 local_3a0 [16];
  EntryPointDescription desc;
  _Any_data local_208;
  _Manager_type local_1f8;
  _Invoker_type local_1f0;
  spv_result_t local_38;
  
  binary_00.super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>._M_t
  .super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>.
  super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl =
       (__uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>)
       operator_new(0x10);
  *(uint32_t **)
   binary_00.super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>.
   _M_t.super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>.
   super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl = words;
  *(size_t *)
   ((long)binary_00.
          super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>._M_t.
          super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>.
          super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl + 8) = num_words;
  binary._M_t.super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>.
  _M_t.super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>.
  super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl =
       (__uniq_ptr_data<spv_const_binary_t,_std::default_delete<spv_const_binary_t>,_true,_true>)
       (__uniq_ptr_data<spv_const_binary_t,_std::default_delete<spv_const_binary_t>,_true,_true>)
       binary_00.super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
       ._M_t.super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>.
       super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl;
  sVar8 = spvBinaryEndianness((spv_const_binary)
                              binary_00.
                              super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                              .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,
                              &endian);
  if (sVar8 != SPV_SUCCESS) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"",(allocator<char> *)&hijacked_context);
    position.index = 0;
    position.line = 0;
    position.column = 0;
    DiagnosticStream::DiagnosticStream
              ((DiagnosticStream *)&local_208,position,&context->consumer,&desc.name,
               SPV_ERROR_INVALID_BINARY);
    pcVar22 = "Invalid SPIR-V magic number.";
LAB_00253acd:
    std::operator<<((ostream *)local_208._M_pod_data,pcVar22);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
    sVar8 = local_38;
LAB_00253ae4:
    std::__cxx11::string::_M_dispose();
    goto LAB_00253ae9;
  }
  sVar8 = spvBinaryHeaderGet((spv_const_binary)
                             binary_00.
                             super___uniq_ptr_impl<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv_const_binary_t_*,_std::default_delete<spv_const_binary_t>_>
                             .super__Head_base<0UL,_spv_const_binary_t_*,_false>._M_head_impl,endian
                             ,&header);
  if (sVar8 != SPV_SUCCESS) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"",(allocator<char> *)&hijacked_context);
    position_00.index = 0;
    position_00.line = 0;
    position_00.column = 0;
    DiagnosticStream::DiagnosticStream
              ((DiagnosticStream *)&local_208,position_00,&context->consumer,&desc.name,
               SPV_ERROR_INVALID_BINARY);
    pcVar22 = "Invalid SPIR-V header.";
    goto LAB_00253acd;
  }
  uVar9 = spvVersionForTargetEnv(context->target_env);
  if (uVar9 < header.version) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"",(allocator<char> *)&hijacked_context);
    position_01.index = 0;
    position_01.line = 0;
    position_01.column = 0;
    DiagnosticStream::DiagnosticStream
              ((DiagnosticStream *)&local_208,position_01,&context->consumer,&desc.name,
               SPV_ERROR_WRONG_VERSION);
    std::operator<<((ostream *)local_208._M_pod_data,"Invalid SPIR-V binary version ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    pcVar22 = ".";
    std::operator<<((ostream *)local_208._M_pod_data,".");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)local_208._M_pod_data," for target environment ");
    pcVar12 = spvTargetEnvDescription(context->target_env);
    std::operator<<((ostream *)local_208._M_pod_data,pcVar12);
    goto LAB_00253acd;
  }
  if ((vstate->options_->universal_limits_).max_id_bound < header.bound) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"",(allocator<char> *)&hijacked_context);
    position_02.index = 0;
    position_02.line = 0;
    position_02.column = 0;
    DiagnosticStream::DiagnosticStream
              ((DiagnosticStream *)&local_208,position_02,&context->consumer,&desc.name,
               SPV_ERROR_INVALID_BINARY);
    std::operator<<((ostream *)local_208._M_pod_data,
                    "Invalid SPIR-V.  The id bound is larger than the max id bound ");
    pDVar13 = DiagnosticStream::operator<<
                        ((DiagnosticStream *)&local_208,
                         &(vstate->options_->universal_limits_).max_id_bound);
    std::operator<<((ostream *)pDVar13,".");
    sVar8 = pDVar13->error_;
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
    goto LAB_00253ae4;
  }
  spv_context_t::spv_context_t(&hijacked_context,context);
  p_Var4 = hijacked_context.consumer.super__Function_base._M_manager;
  local_208._M_unused._M_object =
       hijacked_context.consumer.super__Function_base._M_functor._M_unused._M_object;
  local_208._8_8_ = hijacked_context.consumer.super__Function_base._M_functor._8_8_;
  hijacked_context.consumer.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  hijacked_context.consumer.super__Function_base._M_functor._8_8_ = 0;
  local_1f8 = hijacked_context.consumer.super__Function_base._M_manager;
  hijacked_context.consumer.super__Function_base._M_manager =
       std::
       _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate.cpp:197:31)>
       ::_M_manager;
  local_1f0 = hijacked_context.consumer._M_invoker;
  hijacked_context.consumer._M_invoker =
       std::
       _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate.cpp:197:31)>
       ::_M_invoke;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)(&local_208,&local_208,__destroy_functor);
  }
  spvBinaryParse(&hijacked_context,vstate,words,num_words,(spv_parsed_header_fn_t)0x0,
                 ProcessExtensions,(spv_diagnostic *)0x0);
  sVar8 = spvBinaryParse(context,vstate,words,num_words,(spv_parsed_header_fn_t)0x0,
                         ProcessInstruction,pDiagnostic);
  if (sVar8 == SPV_SUCCESS) {
    local_520 = 0;
    visited_entry_points.
    super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    visited_entry_points.
    super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    visited_entry_points.
    super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pIVar24 = (vstate->ordered_instructions_).
              super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_510 = (vstate->ordered_instructions_).
                super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_530 = 0;
    local_538 = 0;
    for (; pIVar24 != local_510; pIVar24 = pIVar24 + 1) {
      uVar7 = (pIVar24->inst_).opcode;
      inst = pIVar24;
      if (uVar7 == 0xf) {
        local_518 = pIVar24;
        uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar24,1);
        execution_model = Instruction::GetOperandAs<spv::ExecutionModel>(inst,0);
        Instruction::GetOperandAs<std::__cxx11::string>(&desc_name,inst,2);
        desc.name._M_dataplus._M_p = (pointer)&desc.name.field_2;
        desc.name._M_string_length = 0;
        desc.name.field_2._M_local_buf[0] = '\0';
        desc.interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        desc.interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        desc.interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::_M_assign((string *)&desc);
        interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar19 = 0x30;
        for (uVar23 = 3;
            psVar1 = (inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar23 < (ulong)((long)(inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
            uVar23 = uVar23 + 1) {
          local_208._0_4_ =
               (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[*(ushort *)((long)&psVar1->offset + lVar19)]
          ;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&desc.interfaces,(uint *)local_208._M_pod_data);
          lVar19 = lVar19 + 0x10;
        }
        ValidationState_t::RegisterEntryPoint(vstate,uVar10,execution_model,&desc);
        local_508 = visited_entry_points.
                    super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        ppIVar20 = visited_entry_points.
                   super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (visited_entry_points.
            super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            visited_entry_points.
            super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
LAB_00253fa1:
          std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>::
          push_back(&visited_entry_points,&inst);
          local_538 = CONCAT71((int7)((ulong)local_538 >> 8),
                               (byte)local_538 | execution_model - TaskNV < 2);
          local_530 = CONCAT71((int7)((ulong)local_530 >> 8),
                               (byte)local_530 | (execution_model & ~TessellationControl) == TaskEXT
                              );
          bVar6 = true;
        }
        else {
          do {
            if (ppIVar20 == local_508) goto LAB_00253fa1;
            pIVar18 = *ppIVar20;
            EVar11 = Instruction::GetOperandAs<spv::ExecutionModel>(pIVar18,0);
            Instruction::GetOperandAs<std::__cxx11::string>(&check_name,pIVar18,2);
            _Var5 = std::operator==(&desc_name,&check_name);
            if (execution_model == EVar11 && _Var5) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_DATA,inst);
              std::operator<<((ostream *)local_208._M_pod_data,
                              "2 Entry points cannot share the same name and ExecutionMode.");
              local_520 = (ulong)(uint)local_38;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
            }
            std::__cxx11::string::_M_dispose();
            ppIVar20 = ppIVar20 + 1;
          } while (execution_model != EVar11 || !_Var5);
          bVar6 = false;
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        ValidationState_t::EntryPointDescription::~EntryPointDescription(&desc);
        std::__cxx11::string::_M_dispose();
        if (!bVar6) {
          sVar8 = (spv_result_t)local_520;
          goto LAB_00254692;
        }
        uVar7 = (inst->inst_).opcode;
        pIVar24 = local_518;
      }
      if (uVar7 == 0x39) {
        bVar6 = ValidationState_t::in_function_body(vstate);
        if (!bVar6) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,pIVar24);
          std::operator<<((ostream *)local_208._M_pod_data,
                          "A FunctionCall must happen within a function body.");
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
          sVar8 = local_38;
          goto LAB_00254692;
        }
        uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        ValidationState_t::AddFunctionCallTarget(vstate,uVar10);
      }
      bVar6 = ValidationState_t::in_function_body(vstate);
      pIVar18 = inst;
      if (bVar6) {
        pFVar14 = ValidationState_t::current_function(vstate);
        pIVar3 = inst;
        pIVar18->function_ = pFVar14;
        pFVar14 = ValidationState_t::current_function(vstate);
        pBVar15 = Function::current_block(pFVar14);
        pIVar3->block_ = pBVar15;
        bVar6 = ValidationState_t::in_block(vstate);
        if ((bVar6) && (bVar6 = spvOpcodeIsBlockTerminator((uint)(inst->inst_).opcode), bVar6)) {
          pFVar14 = ValidationState_t::current_function(vstate);
          pBVar15 = Function::current_block(pFVar14);
          pBVar15->terminator_ = inst;
        }
      }
      sVar8 = IdPass(vstate,inst);
      if ((((sVar8 != SPV_SUCCESS) || (sVar8 = CapabilityPass(vstate,pIVar24), sVar8 != SPV_SUCCESS)
           ) || (sVar8 = ModuleLayoutPass(vstate,pIVar24), sVar8 != SPV_SUCCESS)) ||
         ((sVar8 = CfgPass(vstate,pIVar24), sVar8 != SPV_SUCCESS ||
          (sVar8 = InstructionPass(vstate,pIVar24), sVar8 != SPV_SUCCESS)))) goto LAB_00254692;
      ValidationState_t::RegisterInstruction(vstate,pIVar24);
      if ((pIVar24->inst_).opcode == 0x27) {
        uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar24,0);
        ValidationState_t::RegisterForwardPointer(vstate,uVar10);
      }
    }
    if ((vstate->addressing_model_ == Max) || (vstate->memory_model_ == Max)) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,(Instruction *)0x0);
      pcVar22 = "Missing required OpMemoryModel instruction.";
LAB_002541ce:
      std::operator<<((ostream *)local_208._M_pod_data,pcVar22);
    }
    else {
      bVar6 = ValidationState_t::in_function_body(vstate);
      if (bVar6) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,(Instruction *)0x0
                  );
        pcVar22 = "Missing OpFunctionEnd at end of module.";
        goto LAB_002541ce;
      }
      bVar6 = EnumSet<spv::Capability>::contains(&vstate->module_capabilities_,BindlessTextureNV);
      if ((bVar6) && (vstate->sampler_image_addressing_mode_ == 0)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,(Instruction *)0x0
                  );
        pcVar22 = "Missing required OpSamplerImageAddressingModeNV instruction.";
        goto LAB_002541ce;
      }
      if (((byte)local_530 & (byte)local_538 & 1) == 0) {
        sVar16 = ValidationState_t::unresolved_forward_id_count(vstate);
        if (sVar16 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&desc);
          ValidationState_t::UnresolvedForwardIds
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                     vstate);
          local_3a0._0_8_ = &desc.name.field_2;
          local_3a0._8_8_ = " ";
          inst = (Instruction *)ValidationState_t::getIdName_abi_cxx11_;
          local_548 = 0;
          local_540 = vstate;
          std::
          transform<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>,std::_Bind<std::__cxx11::string(spvtools::val::ValidationState_t::*(std::reference_wrapper<spvtools::val::ValidationState_t>,std::_Placeholder<1>))(unsigned_int)const>>
                    ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )&local_208,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
                      *)interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
                     (_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(spvtools::val::ValidationState_t::*(std::reference_wrapper<spvtools::val::ValidationState_t>,_std::_Placeholder<1>))(unsigned_int)_const>
                      *)local_3a0);
          std::__cxx11::stringbuf::str();
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_ID,(Instruction *)0x0);
          std::operator<<((ostream *)local_208._M_pod_data,
                          "The following forward referenced IDs have not been defined:\n");
          std::__cxx11::string::substr((ulong)&check_name,(ulong)&desc_name);
          std::operator<<((ostream *)local_208._M_pod_data,(string *)&check_name);
          sVar8 = local_38;
          std::__cxx11::string::_M_dispose();
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
          std::__cxx11::string::_M_dispose();
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::__cxx11::stringstream::~stringstream((stringstream *)&desc);
          if (sVar8 != SPV_SUCCESS) goto LAB_00254692;
        }
        ReachabilityPass(vstate);
        uVar23 = 0xffffffffffffffff;
        lVar19 = 0;
        do {
          pIVar24 = (vstate->ordered_instructions_).
                    super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar23 = uVar23 + 1;
          if ((ulong)(((long)(vstate->ordered_instructions_).
                             super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar24) / 0x88) <=
              uVar23) {
            uVar23 = 0xffffffffffffffff;
            lVar19 = 0;
            goto LAB_00254468;
          }
          pIVar18 = (Instruction *)
                    ((long)&(pIVar24->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    + lVar19);
          lVar19 = lVar19 + 0x88;
          sVar8 = UpdateIdUse(vstate,pIVar18);
        } while (sVar8 == SPV_SUCCESS);
        goto LAB_00254692;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,(Instruction *)0x0);
      ValidationState_t::VkErrorID_abi_cxx11_(&desc.name,vstate,0x1bbe,(char *)0x0);
      std::operator<<((ostream *)local_208._M_pod_data,(string *)&desc);
      std::operator<<((ostream *)local_208._M_pod_data,
                      "Module can\'t mix MeshEXT/TaskEXT with MeshNV/TaskNV Execution Model.");
      std::__cxx11::string::_M_dispose();
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
    sVar8 = local_38;
    goto LAB_00254692;
  }
  goto LAB_0025469f;
LAB_00254468:
  pIVar24 = (vstate->ordered_instructions_).
            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar23 = uVar23 + 1;
  if ((ulong)(((long)(vstate->ordered_instructions_).
                     super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar24) / 0x88) <= uVar23)
  {
    sVar8 = ValidateAdjacency(vstate);
    if (sVar8 == SPV_SUCCESS) {
      ValidationState_t::ComputeFunctionToEntryPointMapping(vstate);
      ValidationState_t::ComputeRecursiveEntryPoints(vstate);
      val = (vstate->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
      puVar21 = (vstate->entry_points_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (val == puVar21) {
        bVar6 = EnumSet<spv::Capability>::contains(&vstate->module_capabilities_,Linkage);
        if (!bVar6) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_BINARY,
                     (Instruction *)0x0);
          std::operator<<((ostream *)local_208._M_pod_data,
                          "No OpEntryPoint instruction was found. This is only allowed if the Linkage capability is being used."
                         );
          sVar8 = local_38;
          goto LAB_0025488d;
        }
        val = (vstate->entry_points_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
        puVar21 = (vstate->entry_points_).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      goto LAB_00254728;
    }
    goto LAB_00254692;
  }
  _ = (ValidationState_t *)
      ((long)&(pIVar24->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl + lVar19);
  sVar8 = MiscPass(vstate,(Instruction *)_);
  if (((((sVar8 != SPV_SUCCESS) ||
        (sVar8 = DebugPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)) ||
       (sVar8 = AnnotationPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)) ||
      (((((((sVar8 = ExtensionPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
            (sVar8 = ModeSettingPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)) ||
           ((sVar8 = TypePass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
            ((sVar8 = ConstantPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
             (sVar8 = MemoryPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)))))) ||
          (sVar8 = FunctionPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)) ||
         (((sVar8 = ImagePass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
           (sVar8 = ConversionPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)) ||
          (sVar8 = CompositesPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)))) ||
        (((sVar8 = ArithmeticsPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
          (sVar8 = BitwisePass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)) ||
         ((sVar8 = LogicalsPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
          ((sVar8 = ControlFlowPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
           (sVar8 = DerivativesPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)))))))) ||
       ((sVar8 = AtomicsPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
        ((((sVar8 = PrimitivesPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
           (sVar8 = BarriersPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)) ||
          (sVar8 = NonUniformPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)) ||
         ((sVar8 = LiteralsPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
          (sVar8 = RayQueryPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS)))))))))) ||
     ((sVar8 = RayTracingPass(vstate,(Instruction *)_), sVar8 != SPV_SUCCESS ||
      (sVar8 = RayReorderNVPass((val *)vstate,_,inst_00), sVar8 != SPV_SUCCESS))))
  goto LAB_00254692;
  lVar19 = lVar19 + 0x88;
  sVar8 = MeshShadingPass(vstate,(Instruction *)_);
  if (sVar8 != SPV_SUCCESS) goto LAB_00254692;
  goto LAB_00254468;
LAB_0025476b:
  sVar8 = ValidateFloatControls2(vstate);
  if (sVar8 == SPV_SUCCESS) {
    sVar8 = ValidateDuplicateExecutionModes(vstate);
    goto LAB_00254895;
  }
  goto LAB_00254692;
LAB_00254728:
  if (val == puVar21) goto LAB_0025476b;
  bVar6 = ValidationState_t::IsFunctionCallTarget(vstate,*val);
  if (!bVar6) {
    bVar6 = spvIsVulkanEnv(vstate->context_->target_env);
    if ((bVar6) &&
       (cVar17 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(&(vstate->recursive_entry_points_)._M_t,val),
       (_Rb_tree_header *)cVar17._M_node !=
       &(vstate->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header)) {
      pIVar18 = ValidationState_t::FindDef(vstate,*val);
      ValidationState_t::diag
                ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_BINARY,pIVar18);
      ValidationState_t::VkErrorID_abi_cxx11_(&desc.name,vstate,0x121a,(char *)0x0);
      std::operator<<((ostream *)local_208._M_pod_data,(string *)&desc);
      std::operator<<((ostream *)local_208._M_pod_data,
                      "Entry points may not have a call graph with cycles.");
      std::__cxx11::string::_M_dispose();
      sVar8 = local_38;
      goto LAB_0025488d;
    }
    val = val + 1;
    goto LAB_00254728;
  }
  pIVar18 = ValidationState_t::FindDef(vstate,*val);
  ValidationState_t::diag((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_BINARY,pIVar18);
  std::operator<<((ostream *)local_208._M_pod_data,"A function (");
  pDVar13 = DiagnosticStream::operator<<((DiagnosticStream *)&local_208,val);
  std::operator<<((ostream *)pDVar13,
                  ") may not be targeted by both an OpEntryPoint instruction and an OpFunctionCall instruction."
                 );
  sVar8 = pDVar13->error_;
LAB_0025488d:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
LAB_00254895:
  if (((((sVar8 == SPV_SUCCESS) && (sVar8 = PerformCfgChecks(vstate), sVar8 == SPV_SUCCESS)) &&
       (sVar8 = CheckIdDefinitionDominateUse(vstate), sVar8 == SPV_SUCCESS)) &&
      ((sVar8 = ValidateDecorations(vstate), sVar8 == SPV_SUCCESS &&
       (sVar8 = ValidateInterfaces(vstate), sVar8 == SPV_SUCCESS)))) &&
     (sVar8 = ValidateBuiltIns(vstate), sVar8 == SPV_SUCCESS)) {
    pIVar24 = (vstate->ordered_instructions_).
              super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar2 = (vstate->ordered_instructions_).
             super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (pIVar24 != pIVar2) {
      sVar8 = ValidateExecutionLimitations(vstate,pIVar24);
      if ((sVar8 != SPV_SUCCESS) ||
         (sVar8 = ValidateSmallTypeUses(vstate,pIVar24), sVar8 != SPV_SUCCESS)) goto LAB_00254692;
      sVar8 = ValidateQCOMImageProcessingTextureUsages(vstate,pIVar24);
      pIVar24 = pIVar24 + 1;
      if (sVar8 != SPV_SUCCESS) goto LAB_00254692;
    }
    sVar8 = SPV_SUCCESS;
  }
LAB_00254692:
  std::_Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>::
  ~_Vector_base(&visited_entry_points.
                 super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
               );
LAB_0025469f:
  if (hijacked_context.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*hijacked_context.consumer.super__Function_base._M_manager)
              ((_Any_data *)&hijacked_context.consumer,(_Any_data *)&hijacked_context.consumer,
               __destroy_functor);
  }
LAB_00253ae9:
  std::unique_ptr<spv_const_binary_t,_std::default_delete<spv_const_binary_t>_>::~unique_ptr
            (&binary);
  return sVar8;
}

Assistant:

spv_result_t ValidateBinaryUsingContextAndValidationState(
    const spv_context_t& context, const uint32_t* words, const size_t num_words,
    spv_diagnostic* pDiagnostic, ValidationState_t* vstate) {
  auto binary = std::unique_ptr<spv_const_binary_t>(
      new spv_const_binary_t{words, num_words});

  spv_endianness_t endian;
  spv_position_t position = {};
  if (spvBinaryEndianness(binary.get(), &endian)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V magic number.";
  }

  spv_header_t header;
  if (spvBinaryHeaderGet(binary.get(), endian, &header)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V header.";
  }

  if (header.version > spvVersionForTargetEnv(context.target_env)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_WRONG_VERSION)
           << "Invalid SPIR-V binary version "
           << SPV_SPIRV_VERSION_MAJOR_PART(header.version) << "."
           << SPV_SPIRV_VERSION_MINOR_PART(header.version)
           << " for target environment "
           << spvTargetEnvDescription(context.target_env) << ".";
  }

  if (header.bound > vstate->options()->universal_limits_.max_id_bound) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V.  The id bound is larger than the max id bound "
           << vstate->options()->universal_limits_.max_id_bound << ".";
  }

  // Look for OpExtension instructions and register extensions.
  // This parse should not produce any error messages. Hijack the context and
  // replace the message consumer so that we do not pollute any state in input
  // consumer.
  spv_context_t hijacked_context = context;
  hijacked_context.consumer = [](spv_message_level_t, const char*,
                                 const spv_position_t&, const char*) {};
  spvBinaryParse(&hijacked_context, vstate, words, num_words,
                 /* parsed_header = */ nullptr, ProcessExtensions,
                 /* diagnostic = */ nullptr);

  // Parse the module and perform inline validation checks. These checks do
  // not require the knowledge of the whole module.
  if (auto error = spvBinaryParse(&context, vstate, words, num_words,
                                  /*parsed_header =*/nullptr,
                                  ProcessInstruction, pDiagnostic)) {
    return error;
  }

  bool has_mask_task_nv = false;
  bool has_mask_task_ext = false;
  std::vector<Instruction*> visited_entry_points;
  for (auto& instruction : vstate->ordered_instructions()) {
    {
      // In order to do this work outside of Process Instruction we need to be
      // able to, briefly, de-const the instruction.
      Instruction* inst = const_cast<Instruction*>(&instruction);

      if (inst->opcode() == spv::Op::OpEntryPoint) {
        const auto entry_point = inst->GetOperandAs<uint32_t>(1);
        const auto execution_model = inst->GetOperandAs<spv::ExecutionModel>(0);
        const std::string desc_name = inst->GetOperandAs<std::string>(2);

        ValidationState_t::EntryPointDescription desc;
        desc.name = desc_name;

        std::vector<uint32_t> interfaces;
        for (size_t j = 3; j < inst->operands().size(); ++j)
          desc.interfaces.push_back(inst->word(inst->operand(j).offset));

        vstate->RegisterEntryPoint(entry_point, execution_model,
                                   std::move(desc));

        if (visited_entry_points.size() > 0) {
          for (const Instruction* check_inst : visited_entry_points) {
            const auto check_execution_model =
                check_inst->GetOperandAs<spv::ExecutionModel>(0);
            const std::string check_name =
                check_inst->GetOperandAs<std::string>(2);

            if (desc_name == check_name &&
                execution_model == check_execution_model) {
              return vstate->diag(SPV_ERROR_INVALID_DATA, inst)
                     << "2 Entry points cannot share the same name and "
                        "ExecutionMode.";
            }
          }
        }
        visited_entry_points.push_back(inst);

        has_mask_task_nv |= (execution_model == spv::ExecutionModel::TaskNV ||
                             execution_model == spv::ExecutionModel::MeshNV);
        has_mask_task_ext |= (execution_model == spv::ExecutionModel::TaskEXT ||
                              execution_model == spv::ExecutionModel::MeshEXT);
      }
      if (inst->opcode() == spv::Op::OpFunctionCall) {
        if (!vstate->in_function_body()) {
          return vstate->diag(SPV_ERROR_INVALID_LAYOUT, &instruction)
                 << "A FunctionCall must happen within a function body.";
        }

        const auto called_id = inst->GetOperandAs<uint32_t>(2);
        vstate->AddFunctionCallTarget(called_id);
      }

      if (vstate->in_function_body()) {
        inst->set_function(&(vstate->current_function()));
        inst->set_block(vstate->current_function().current_block());

        if (vstate->in_block() && spvOpcodeIsBlockTerminator(inst->opcode())) {
          vstate->current_function().current_block()->set_terminator(inst);
        }
      }

      if (auto error = IdPass(*vstate, inst)) return error;
    }

    if (auto error = CapabilityPass(*vstate, &instruction)) return error;
    if (auto error = ModuleLayoutPass(*vstate, &instruction)) return error;
    if (auto error = CfgPass(*vstate, &instruction)) return error;
    if (auto error = InstructionPass(*vstate, &instruction)) return error;

    // Now that all of the checks are done, update the state.
    {
      Instruction* inst = const_cast<Instruction*>(&instruction);
      vstate->RegisterInstruction(inst);
      if (inst->opcode() == spv::Op::OpTypeForwardPointer) {
        vstate->RegisterForwardPointer(inst->GetOperandAs<uint32_t>(0));
      }
    }
  }

  if (!vstate->has_memory_model_specified())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing required OpMemoryModel instruction.";

  if (vstate->in_function_body())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing OpFunctionEnd at end of module.";

  if (vstate->HasCapability(spv::Capability::BindlessTextureNV) &&
      !vstate->has_samplerimage_variable_address_mode_specified())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing required OpSamplerImageAddressingModeNV instruction.";

  if (has_mask_task_ext && has_mask_task_nv)
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << vstate->VkErrorID(7102)
           << "Module can't mix MeshEXT/TaskEXT with MeshNV/TaskNV Execution "
              "Model.";

  // Catch undefined forward references before performing further checks.
  if (auto error = ValidateForwardDecls(*vstate)) return error;

  // Calculate reachability after all the blocks are parsed, but early that it
  // can be relied on in subsequent pases.
  ReachabilityPass(*vstate);

  // ID usage needs be handled in its own iteration of the instructions,
  // between the two others. It depends on the first loop to have been
  // finished, so that all instructions have been registered. And the following
  // loop depends on all of the usage data being populated. Thus it cannot live
  // in either of those iterations.
  // It should also live after the forward declaration check, since it will
  // have problems with missing forward declarations, but give less useful error
  // messages.
  for (size_t i = 0; i < vstate->ordered_instructions().size(); ++i) {
    auto& instruction = vstate->ordered_instructions()[i];
    if (auto error = UpdateIdUse(*vstate, &instruction)) return error;
  }

  // Validate individual opcodes.
  for (size_t i = 0; i < vstate->ordered_instructions().size(); ++i) {
    auto& instruction = vstate->ordered_instructions()[i];

    // Keep these passes in the order they appear in the SPIR-V specification
    // sections to maintain test consistency.
    if (auto error = MiscPass(*vstate, &instruction)) return error;
    if (auto error = DebugPass(*vstate, &instruction)) return error;
    if (auto error = AnnotationPass(*vstate, &instruction)) return error;
    if (auto error = ExtensionPass(*vstate, &instruction)) return error;
    if (auto error = ModeSettingPass(*vstate, &instruction)) return error;
    if (auto error = TypePass(*vstate, &instruction)) return error;
    if (auto error = ConstantPass(*vstate, &instruction)) return error;
    if (auto error = MemoryPass(*vstate, &instruction)) return error;
    if (auto error = FunctionPass(*vstate, &instruction)) return error;
    if (auto error = ImagePass(*vstate, &instruction)) return error;
    if (auto error = ConversionPass(*vstate, &instruction)) return error;
    if (auto error = CompositesPass(*vstate, &instruction)) return error;
    if (auto error = ArithmeticsPass(*vstate, &instruction)) return error;
    if (auto error = BitwisePass(*vstate, &instruction)) return error;
    if (auto error = LogicalsPass(*vstate, &instruction)) return error;
    if (auto error = ControlFlowPass(*vstate, &instruction)) return error;
    if (auto error = DerivativesPass(*vstate, &instruction)) return error;
    if (auto error = AtomicsPass(*vstate, &instruction)) return error;
    if (auto error = PrimitivesPass(*vstate, &instruction)) return error;
    if (auto error = BarriersPass(*vstate, &instruction)) return error;
    // Group
    // Device-Side Enqueue
    // Pipe
    if (auto error = NonUniformPass(*vstate, &instruction)) return error;

    if (auto error = LiteralsPass(*vstate, &instruction)) return error;
    if (auto error = RayQueryPass(*vstate, &instruction)) return error;
    if (auto error = RayTracingPass(*vstate, &instruction)) return error;
    if (auto error = RayReorderNVPass(*vstate, &instruction)) return error;
    if (auto error = MeshShadingPass(*vstate, &instruction)) return error;
  }

  // Validate the preconditions involving adjacent instructions. e.g.
  // spv::Op::OpPhi must only be preceded by spv::Op::OpLabel, spv::Op::OpPhi,
  // or spv::Op::OpLine.
  if (auto error = ValidateAdjacency(*vstate)) return error;

  if (auto error = ValidateEntryPoints(*vstate)) return error;
  // CFG checks are performed after the binary has been parsed
  // and the CFGPass has collected information about the control flow
  if (auto error = PerformCfgChecks(*vstate)) return error;
  if (auto error = CheckIdDefinitionDominateUse(*vstate)) return error;
  if (auto error = ValidateDecorations(*vstate)) return error;
  if (auto error = ValidateInterfaces(*vstate)) return error;
  // TODO(dsinclair): Restructure ValidateBuiltins so we can move into the
  // for() above as it loops over all ordered_instructions internally.
  if (auto error = ValidateBuiltIns(*vstate)) return error;
  // These checks must be performed after individual opcode checks because
  // those checks register the limitation checked here.
  for (const auto& inst : vstate->ordered_instructions()) {
    if (auto error = ValidateExecutionLimitations(*vstate, &inst)) return error;
    if (auto error = ValidateSmallTypeUses(*vstate, &inst)) return error;
    if (auto error = ValidateQCOMImageProcessingTextureUsages(*vstate, &inst))
      return error;
  }

  return SPV_SUCCESS;
}